

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

int amqp_try_recv(amqp_connection_state_t state,uint64_t current_time)

{
  int iVar1;
  amqp_pool_t *pool;
  undefined8 *puVar2;
  amqp_link_t *paVar3;
  amqp_link_t *paVar4;
  amqp_frame_t frame;
  amqp_frame_t local_68;
  
  if (state->sock_inbound_offset < state->sock_inbound_limit) {
    do {
      iVar1 = consume_one_frame(state,&local_68);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (local_68.frame_type != '\0') {
        pool = amqp_get_or_create_channel_pool(state,local_68.channel);
        if (pool == (amqp_pool_t *)0x0) {
          return -1;
        }
        puVar2 = (undefined8 *)amqp_pool_alloc(pool,0x30);
        paVar3 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
        if (puVar2 == (undefined8 *)0x0) {
          return -1;
        }
        if (paVar3 == (amqp_link_t *)0x0) {
          return -1;
        }
        puVar2[4] = local_68.payload.properties.raw.len;
        puVar2[5] = local_68.payload.properties.raw.bytes;
        puVar2[2] = local_68.payload.method.decoded;
        puVar2[3] = local_68.payload.properties.decoded;
        *puVar2 = local_68._0_8_;
        puVar2[1] = local_68.payload.body_fragment.len;
        paVar3->next = (amqp_link_t_ *)0x0;
        paVar3->data = puVar2;
        paVar4 = state->last_queued_frame;
        if (state->last_queued_frame == (amqp_link_t *)0x0) {
          paVar4 = (amqp_link_t *)&state->first_queued_frame;
        }
        paVar4->next = paVar3;
        state->last_queued_frame = paVar3;
      }
    } while (state->sock_inbound_offset < state->sock_inbound_limit);
  }
  local_68.frame_type = '\0';
  local_68._1_1_ = 0;
  local_68.channel = 0;
  local_68._4_4_ = 0;
  local_68.payload.body_fragment.len = 0;
  iVar1 = recv_with_timeout(state,current_time,(timeval *)&local_68);
  return iVar1;
}

Assistant:

int amqp_try_recv(amqp_connection_state_t state, uint64_t current_time)
{
  struct timeval tv;

  while (amqp_data_in_buffer(state)) {
    amqp_frame_t frame;
    int res = consume_one_frame(state, &frame);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (frame.frame_type != 0) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;
    }
  }

  memset(&tv, 0, sizeof(struct timeval));
  tv.tv_sec = 0;
  tv.tv_usec = 0;

  return recv_with_timeout(state, current_time, &tv);
}